

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OpenSteerDemo.cpp
# Opt level: O3

void anon_unknown.dwarf_e4ad::mouseMotionFunc(GLFWwindow *window,double x,double y)

{
  int iVar1;
  Vec3 local_30;
  double local_20;
  double local_18;
  
  OpenSteer::OpenSteerDemo::mouseX = (int)x;
  OpenSteer::OpenSteerDemo::mouseY = (int)y;
  local_20 = x;
  local_18 = y;
  iVar1 = glfwGetMouseButton(window,0);
  if ((iVar1 != 0) &&
     (((anonymous_namespace)::gMouseAdjustingCameraAngle != '\0' ||
      ((anonymous_namespace)::gMouseAdjustingCameraRadius == '\x01')))) {
    local_30.x = 0.0;
    local_30.y = 0.0;
    local_30.z = 0.0;
    if ((anonymous_namespace)::gMouseAdjustingCameraAngle != '\0') {
      local_30.x = (float)(local_20 - (double)(anonymous_namespace)::gMouseAdjustingCameraLastX) *
                   -0.005;
      local_30.y = (float)(local_18 - (double)(anonymous_namespace)::gMouseAdjustingCameraLastY) *
                   0.005;
    }
    if ((anonymous_namespace)::gMouseAdjustingCameraRadius == '\x01') {
      local_30.z = (float)(local_18 - (double)(anonymous_namespace)::gMouseAdjustingCameraLastY) *
                   0.01;
    }
    (anonymous_namespace)::gMouseAdjustingCameraLastX = (int)x;
    (anonymous_namespace)::gMouseAdjustingCameraLastY = (int)y;
    OpenSteer::Camera::mouseAdjustOffset(&OpenSteer::OpenSteerDemo::camera,&local_30);
  }
  return;
}

Assistant:

void 
    mouseMotionFunc(GLFWwindow* window, double x, double y)
    {
        OpenSteer::OpenSteerDemo::mouseX = static_cast<int>(x);
        OpenSteer::OpenSteerDemo::mouseY = static_cast<int>(y);

        if (glfwGetMouseButton(window, 0))
        {
            // are we currently in the process of mouse-adjusting the camera?
            if (gMouseAdjustingCameraAngle || gMouseAdjustingCameraRadius)
            {
                // speed factors to map from mouse movement in pixels to 3d motion
                const float dSpeed = 0.005f;
                const float rSpeed = 0.01f;

                // XY distance (in pixels) that mouse moved since last update
                const float dx = static_cast<float>(x - gMouseAdjustingCameraLastX);
                const float dy = static_cast<float>(y - gMouseAdjustingCameraLastY);
                gMouseAdjustingCameraLastX = static_cast<int>(x);
                gMouseAdjustingCameraLastY = static_cast<int>(y);

                OpenSteer::Vec3 cameraAdjustment;

                // set XY values according to mouse motion on screen space
                if (gMouseAdjustingCameraAngle)
                {
                    cameraAdjustment.x = dx * -dSpeed;
                    cameraAdjustment.y = dy * +dSpeed;
                }

                // set Z value according vertical to mouse motion
                if (gMouseAdjustingCameraRadius)
                {
                    cameraAdjustment.z = dy * rSpeed;
                }

                // pass adjustment vector to camera's mouse adjustment routine
                OpenSteer::OpenSteerDemo::camera.mouseAdjustOffset (cameraAdjustment);
            }
        }
    }